

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void debugDecompress(uint32_t offset,uint32_t size,istream *in,bool isSwitch)

{
  bool bVar1;
  Size size_00;
  int iVar2;
  ulong uVar3;
  allocator<char> local_379;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Image img;
  string local_320;
  ChunkHeader header;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  path local_278;
  string local_250;
  ofstream out;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(ulong)size,(allocator_type *)&out);
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::seekg((long)in,offset);
  header.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header.transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  operator>>(in,&header);
  std::istream::seekg((long)in,offset);
  std::istream::read((char *)in,
                     (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  iVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_finish -
               (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) <= uVar3) break;
    bVar1 = decompressHigu(&output,data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar3,
                           (int)((long)data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start) + iVar2,isSwitch);
    if (bVar1) {
      std::__cxx11::to_string(&local_320,(int)uVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img,
                     "/tmp/chunks/data",&local_320);
      std::operator+(&local_278._M_pathname,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img,
                     ".dat");
      std::ofstream::ofstream(&out,(string *)&local_278,_S_bin);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&img);
      std::__cxx11::string::~string((string *)&local_320);
      std::ostream::write((char *)&out,
                          (long)output.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      if ((ulong)header.h * (ulong)header.w + 0x400 <=
          (ulong)((long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
        Image::Image(&img,(Size)0x0,(Color)0x0);
        size_00.height._2_2_ = 0;
        size_00._0_6_ = CONCAT24(header.h,header.w + 3) & 0xfffffffffffc;
        getIndexed(&img,&output,size_00,isSwitch,0x100);
        std::__cxx11::to_string(&local_2b8,(int)uVar3);
        std::operator+(&local_298,"/tmp/chunks/data",&local_2b8);
        std::operator+(&local_320,&local_298,".png");
        std::filesystem::__cxx11::path::path(&local_278,&local_320,auto_format);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_379);
        Image::writePNG(&img,&local_278,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::filesystem::__cxx11::path::~path(&local_278);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
                  (&img.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
      }
      std::ofstream::~ofstream(&out);
    }
    uVar3 = uVar3 + 1;
    iVar2 = iVar2 + -1;
  }
  ChunkHeader::~ChunkHeader(&header);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void debugDecompress(uint32_t offset, uint32_t size, std::istream &in, bool isSwitch) {
	std::vector<uint8_t> data(size);
	std::vector<uint8_t> output;
	in.seekg(offset, in.beg);
	ChunkHeader header;
	in >> header;
	in.seekg(offset, in.beg);
	in.read((char *)data.data(), data.size());

	for (int i = 0; i < data.size(); i++) {
		if (decompressHigu(output, data.data() + i, (int)data.size() - i, isSwitch)) {
			std::ofstream out("/tmp/chunks/data" + std::to_string(i) + ".dat", std::ios::binary);
			out.write((char *)output.data(), output.size());
			if (output.size() >= 1024 + header.w * header.h) {
				Image img({0, 0});
				getIndexed(img, output, align({header.w, header.h}), isSwitch);
				img.writePNG("/tmp/chunks/data" + std::to_string(i) + ".png");
			}
		}
	}
}